

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderConfig.cpp
# Opt level: O2

Visibility glu::parseWindowVisibility(CommandLine *cmdLine)

{
  WindowVisibility WVar1;
  InternalError *this;
  allocator<char> local_39;
  string local_38;
  
  WVar1 = tcu::CommandLine::getVisibility(cmdLine);
  if (WVar1 < WINDOWVISIBILITY_LAST) {
    return *(Visibility *)(&DAT_00962edc + (ulong)WVar1 * 4);
  }
  this = (InternalError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Unsupported window visibility",&local_39);
  tcu::InternalError::InternalError(this,&local_38);
  __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

RenderConfig::Visibility parseWindowVisibility (const tcu::CommandLine& cmdLine)
{
	switch (cmdLine.getVisibility())
	{
		case tcu::WINDOWVISIBILITY_HIDDEN:		return RenderConfig::VISIBILITY_HIDDEN;
		case tcu::WINDOWVISIBILITY_WINDOWED:	return RenderConfig::VISIBILITY_VISIBLE;
		case tcu::WINDOWVISIBILITY_FULLSCREEN:	return RenderConfig::VISIBILITY_FULLSCREEN;
		default:
			throw tcu::InternalError("Unsupported window visibility");
	}
}